

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_PeginWitnessTest_Test::TestBody
          (ConfidentialTransaction_PeginWitnessTest_Test *this)

{
  pointer *this_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  ulong uVar2;
  bool bVar3;
  uint32_t uVar4;
  char *pcVar5;
  size_type sVar6;
  const_reference pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  reference pvVar9;
  char *pcVar10;
  AssertHelper local_d88;
  Message local_d80;
  int local_d78;
  uint32_t local_d74;
  undefined1 local_d70 [8];
  AssertionResult gtest_ar_15;
  Message local_d58;
  AssertHelper local_d50;
  Message local_d48 [2];
  CfdException *anon_var_0_3;
  char *pcStack_d30;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  Message local_d20;
  string local_d18;
  undefined1 local_cf8 [8];
  AssertionResult gtest_ar_14;
  Message local_ce0;
  ByteData256 local_cd8;
  AssertHelper local_cc0;
  Message local_cb8;
  string local_cb0;
  string local_c90;
  undefined1 local_c70 [8];
  AssertionResult gtest_ar_13;
  size_t idx_3;
  ScriptWitness local_af8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_ad8;
  AssertHelper local_ac0;
  Message local_ab8;
  string local_ab0;
  string local_a90;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar_12;
  Message local_a58;
  string local_a50;
  string local_a30;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_11;
  Message local_9f8;
  string local_9f0;
  string local_9d0;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_988;
  Message local_980;
  ScriptWitness local_978;
  AssertHelper local_958;
  Message local_950;
  ScriptWitness local_948;
  AssertHelper local_928;
  Message local_920;
  ScriptWitness local_918;
  AssertHelper local_8f8;
  Message local_8f0 [2];
  CfdException *anon_var_0_2;
  byte local_8b9;
  char *pcStack_8b8;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  Message local_8a8 [2];
  CfdException *anon_var_0_1;
  byte local_871;
  char *pcStack_870;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_860;
  string local_858;
  undefined1 local_838 [8];
  AssertionResult gtest_ar_9;
  Message local_820;
  ByteData256 local_818;
  AssertHelper local_800;
  Message local_7f8;
  unsigned_long local_7f0;
  uint32_t local_7e4;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_8;
  Message local_7c8;
  string local_7c0;
  string local_7a0;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_7;
  Message local_768;
  string local_760;
  string local_740;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_6f8;
  Message local_6f0;
  ScriptWitness local_6e8;
  AssertHelper local_6c8;
  Message local_6c0;
  ScriptWitness local_6b8;
  AssertHelper local_698;
  Message local_690 [2];
  CfdException *anon_var_0;
  byte local_659;
  char *pcStack_658;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_648;
  string local_640;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_5;
  Message local_608;
  ByteData256 local_600;
  AssertHelper local_5e8;
  Message local_5e0;
  size_type local_5d8;
  uint32_t local_5cc;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_4;
  Message local_5b0;
  string local_5a8;
  string local_588;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_3;
  size_t idx_2;
  ScriptWitness local_3f0;
  undefined1 local_3d0 [8];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> tx_peg_vector;
  Message local_3b0;
  string local_3a8;
  string local_388;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_2;
  size_t idx_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> test_peg_vector;
  Message local_330;
  ScriptWitness local_328;
  ulong local_308;
  size_t idx;
  ScriptWitness witness;
  Message local_2d8;
  string local_2d0;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_1;
  Message local_298;
  ByteData256 local_290;
  AssertHelper local_278;
  Message local_270;
  int local_268;
  uint32_t local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar;
  Message local_248;
  ByteData local_240;
  ByteData local_228;
  ConfidentialValue local_210;
  ConfidentialValue local_1e8;
  ByteData256 local_1c0;
  ByteData256 local_1a8;
  AssertHelper local_190;
  Message local_188;
  uint32_t local_17c;
  undefined1 local_178 [4];
  uint32_t index;
  ConfidentialTransaction tx;
  ByteData256 witness_only_hash;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *exp_peg_vector;
  string local_f8;
  undefined1 local_d8 [8];
  ByteData256 exp_data256;
  string local_b8;
  undefined1 local_98 [8];
  ByteData160 exp_data160;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  ByteData exp_data;
  ScriptWitness exp_pegin_witness;
  ConfidentialTransaction_PeginWitnessTest_Test *this_local;
  
  GetExpectPeginWitnessStack();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"1234567890",&local_69);
  cfd::core::ByteData::ByteData((ByteData *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b8,"1234567890123456789012345678901234567890",
             (allocator *)
             ((long)&exp_data256.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData160::ByteData160((ByteData160 *)local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&exp_data256.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f8,"1234567890123456789012345678901234567890123456789012345678901234",
             (allocator *)((long)&exp_peg_vector + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_d8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&exp_peg_vector + 7));
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &witness_only_hash.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (ScriptWitness *)
             &exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = &witness_only_hash.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_178,&exp_tx_hex_abi_cxx11_);
  local_17c = 0;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_17c = cfd::core::ConfidentialTransaction::AddTxIn
                            ((ConfidentialTransaction *)local_178,&exp_txid,2,0xfffffffe,&exp_script
                            );
    }
  }
  else {
    testing::Message::Message(&local_188);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x135,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message(&local_188);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    uVar4 = local_17c;
    if (bVar3) {
      cfd::core::ByteData256::ByteData256(&local_1a8,&exp_blinding_nonce);
      cfd::core::ByteData256::ByteData256(&local_1c0,&exp_asset_entropy);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_1e8,&exp_issuance_amount);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_210,&exp_inflation_keys);
      cfd::core::ByteData::ByteData(&local_228,&exp_issuance_amount_rangeproof);
      cfd::core::ByteData::ByteData(&local_240,&exp_inflation_keys_rangeproof);
      cfd::core::ConfidentialTransaction::SetIssuance
                ((ConfidentialTransaction *)local_178,uVar4,&local_1a8,&local_1c0,&local_1e8,
                 &local_210,&local_228,&local_240);
      cfd::core::ByteData::~ByteData(&local_240);
      cfd::core::ByteData::~ByteData(&local_228);
      cfd::core::ConfidentialValue::~ConfidentialValue(&local_210);
      cfd::core::ConfidentialValue::~ConfidentialValue(&local_1e8);
      cfd::core::ByteData256::~ByteData256(&local_1c0);
      cfd::core::ByteData256::~ByteData256(&local_1a8);
    }
  }
  else {
    testing::Message::Message(&local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x13a,
               "Expected: (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_248);
  }
  local_264 = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum
                        ((ConfidentialTransaction *)local_178,local_17c);
  local_268 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_260,"tx.GetPeginWitnessStackNum(index)","0",&local_264,
             &local_268);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar3) {
    testing::Message::Message(&local_270);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x13b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash
                (&local_290,(ConfidentialTransaction *)local_178);
      cfd::core::ByteData256::operator=
                ((ByteData256 *)
                 &tx.vout_.
                  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_290);
      cfd::core::ByteData256::~ByteData256(&local_290);
    }
  }
  else {
    testing::Message::Message(&local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x13e,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_298);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_
            (&local_2d0,
             (ByteData256 *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b0,"witness_only_hash.GetHex().c_str()",
             "\"5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99\"",pcVar5,
             "5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99");
  std::__cxx11::string::~string((string *)&local_2d0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar3) {
    testing::Message::Message(&local_2d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &witness.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x141,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &witness.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &witness.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  cfd::core::ScriptWitness::ScriptWitness((ScriptWitness *)&idx);
  for (local_308 = 0; uVar2 = local_308,
      sVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         this_00), uVar2 < sVar6; local_308 = local_308 + 1) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      bVar3 = testing::internal::AlwaysTrue();
      uVar4 = local_17c;
      if (bVar3) {
        pvVar7 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                           ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                            this_00,local_308);
        cfd::core::ConfidentialTransaction::AddPeginWitnessStack
                  (&local_328,(ConfidentialTransaction *)local_178,uVar4,pvVar7);
        cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_328);
        cfd::core::ScriptWitness::~ScriptWitness(&local_328);
      }
    }
    else {
      testing::Message::Message(&local_330);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &test_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x147,
                 "Expected: (witness = tx.AddPeginWitnessStack(index, exp_peg_vector[idx])) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &test_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_330);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &test_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_330);
    }
  }
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
             (ScriptWitness *)&idx);
  for (gtest_ar_2.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      sVar1.ptr_ = gtest_ar_2.message_.ptr_,
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          this_00), sVar1.ptr_ < pbVar8;
      gtest_ar_2.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_2.message_.ptr_)->field_0x1) {
    pvVar9 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
                        (size_type)gtest_ar_2.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_388,pvVar9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pvVar7 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00
                        ,(size_type)gtest_ar_2.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_3a8,pvVar7);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_368,"test_peg_vector[idx].GetHex().c_str()",
               "exp_peg_vector[idx].GetHex().c_str()",pcVar5,pcVar10);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_388);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
    if (!bVar3) {
      testing::Message::Message(&local_3b0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &tx_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x14c,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &tx_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_3b0);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &tx_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_3b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  }
  cfd::core::ConfidentialTransaction::GetTxIn
            ((ConfidentialTxInReference *)&idx_2,(ConfidentialTransaction *)local_178,local_17c);
  cfd::core::ConfidentialTxInReference::GetPeginWitness
            (&local_3f0,(ConfidentialTxInReference *)&idx_2);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_3d0,
             &local_3f0);
  cfd::core::ScriptWitness::~ScriptWitness(&local_3f0);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)&idx_2);
  for (gtest_ar_3.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      sVar1.ptr_ = gtest_ar_3.message_.ptr_,
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          local_3d0), sVar1.ptr_ < pbVar8;
      gtest_ar_3.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_3.message_.ptr_)->field_0x1) {
    pvVar9 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
                        (size_type)gtest_ar_3.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_588,pvVar9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pvVar9 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        local_3d0,(size_type)gtest_ar_3.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_5a8,pvVar9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_568,"test_peg_vector[idx].GetHex().c_str()",
               "tx_peg_vector[idx].GetHex().c_str()",pcVar5,pcVar10);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_588);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
    if (!bVar3) {
      testing::Message::Message(&local_5b0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x152,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_5b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_5b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  }
  local_5cc = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum
                        ((ConfidentialTransaction *)local_178,local_17c);
  local_5d8 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         this_00);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_5c8,"tx.GetPeginWitnessStackNum(index)",
             "exp_peg_vector.size()",&local_5cc,&local_5d8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar3) {
    testing::Message::Message(&local_5e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x154,pcVar5);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash
                (&local_600,(ConfidentialTransaction *)local_178);
      cfd::core::ByteData256::operator=
                ((ByteData256 *)
                 &tx.vout_.
                  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_600);
      cfd::core::ByteData256::~ByteData256(&local_600);
    }
  }
  else {
    testing::Message::Message(&local_608);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x157,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_608);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_
            (&local_640,
             (ByteData256 *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_620,"witness_only_hash.GetHex().c_str()",
             "\"7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a\"",pcVar5,
             "7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a");
  std::__cxx11::string::~string((string *)&local_640);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar3) {
    testing::Message::Message(&local_648);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x15a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff9a8,"");
  bVar3 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff9a8);
  if (bVar3) {
    local_659 = 0;
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::AddPeginWitnessStack
                ((ScriptWitness *)&anon_var_0,(ConfidentialTransaction *)local_178,local_17c + 5,
                 (ByteData160 *)local_98);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,(ScriptWitness *)&anon_var_0);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&anon_var_0);
    }
    if ((local_659 & 1) == 0) {
      pcStack_658 = 
      "Expected: (witness = tx.AddPeginWitnessStack(index + 5, exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_004819da;
    }
  }
  else {
LAB_004819da:
    testing::Message::Message(local_690);
    testing::internal::AssertHelper::AssertHelper
              (&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x15e,pcStack_658);
    testing::internal::AssertHelper::operator=(&local_698,local_690);
    testing::internal::AssertHelper::~AssertHelper(&local_698);
    testing::Message::~Message(local_690);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::AddPeginWitnessStack
                (&local_6b8,(ConfidentialTransaction *)local_178,local_17c,(ByteData160 *)local_98);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_6b8);
      cfd::core::ScriptWitness::~ScriptWitness(&local_6b8);
    }
  }
  else {
    testing::Message::Message(&local_6c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x15f,
               "Expected: (witness = tx.AddPeginWitnessStack(index, exp_data160)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
    testing::Message::~Message(&local_6c0);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::AddPeginWitnessStack
                (&local_6e8,(ConfidentialTransaction *)local_178,local_17c,(ByteData256 *)local_d8);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_6e8);
      cfd::core::ScriptWitness::~ScriptWitness(&local_6e8);
    }
  }
  else {
    testing::Message::Message(&local_6f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x160,
               "Expected: (witness = tx.AddPeginWitnessStack(index, exp_data256)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_6f8,&local_6f0);
    testing::internal::AssertHelper::~AssertHelper(&local_6f8);
    testing::Message::~Message(&local_6f0);
  }
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_,(ScriptWitness *)&idx);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_);
  sVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
  pvVar9 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
                      sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_740,pvVar9);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_760,(ByteData160 *)local_98);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_720,"test_peg_vector[exp_peg_vector.size()].GetHex().c_str()",
             "exp_data160.GetHex().c_str()",pcVar5,pcVar10);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)&local_740);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar3) {
    testing::Message::Message(&local_768);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x163,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  sVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
  pvVar9 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
                      sVar6 + 1);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_7a0,pvVar9);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_7c0,(ByteData256 *)local_d8);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_780,"test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str()",
             "exp_data256.GetHex().c_str()",pcVar5,pcVar10);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_7a0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar3) {
    testing::Message::Message(&local_7c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x165,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  local_7e4 = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum
                        ((ConfidentialTransaction *)local_178,local_17c);
  sVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
  local_7f0 = sVar6 + 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_7e0,"tx.GetPeginWitnessStackNum(index)",
             "exp_peg_vector.size() + 2",&local_7e4,&local_7f0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar3) {
    testing::Message::Message(&local_7f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_800,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x166,pcVar5);
    testing::internal::AssertHelper::operator=(&local_800,&local_7f8);
    testing::internal::AssertHelper::~AssertHelper(&local_800);
    testing::Message::~Message(&local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash
                (&local_818,(ConfidentialTransaction *)local_178);
      cfd::core::ByteData256::operator=
                ((ByteData256 *)
                 &tx.vout_.
                  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_818);
      cfd::core::ByteData256::~ByteData256(&local_818);
    }
  }
  else {
    testing::Message::Message(&local_820);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x169,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_820);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_
            (&local_858,
             (ByteData256 *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_838,"witness_only_hash.GetHex().c_str()",
             "\"ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf\"",pcVar5,
             "ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf");
  std::__cxx11::string::~string((string *)&local_858);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_838);
  if (!bVar3) {
    testing::Message::Message(&local_860);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_838);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x16c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,&local_860);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(&local_860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_838);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff790,"");
  bVar3 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff790);
  if (bVar3) {
    local_871 = 0;
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      uVar4 = local_17c + 5;
      sVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         this_00);
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((ScriptWitness *)&anon_var_0_1,(ConfidentialTransaction *)local_178,uVar4,
                 (uint32_t)sVar6,(ByteData160 *)local_98);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,(ScriptWitness *)&anon_var_0_1);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&anon_var_0_1);
    }
    if ((local_871 & 1) == 0) {
      pcStack_870 = 
      "Expected: (witness = tx.SetPeginWitnessStack(index + 5, static_cast<size_t>(exp_peg_vector.size()), exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_004826c7;
    }
  }
  else {
LAB_004826c7:
    testing::Message::Message(local_8a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x172,pcStack_870);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_2,local_8a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_2);
    testing::Message::~Message(local_8a8);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff748,"");
  bVar3 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff748);
  if (bVar3) {
    local_8b9 = 0;
    bVar3 = testing::internal::AlwaysTrue();
    uVar4 = local_17c;
    if (bVar3) {
      sVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         this_00);
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((ScriptWitness *)&anon_var_0_2,(ConfidentialTransaction *)local_178,uVar4,
                 (int)sVar6 + 5,(ByteData160 *)local_98);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,(ScriptWitness *)&anon_var_0_2);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&anon_var_0_2);
    }
    if ((local_8b9 & 1) == 0) {
      pcStack_8b8 = 
      "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 5, exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_004828bf;
    }
  }
  else {
LAB_004828bf:
    testing::Message::Message(local_8f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x176,pcStack_8b8);
    testing::internal::AssertHelper::operator=(&local_8f8,local_8f0);
    testing::internal::AssertHelper::~AssertHelper(&local_8f8);
    testing::Message::~Message(local_8f0);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                (&local_918,(ConfidentialTransaction *)local_178,local_17c,0,(ByteData *)local_48);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_918);
      cfd::core::ScriptWitness::~ScriptWitness(&local_918);
    }
  }
  else {
    testing::Message::Message(&local_920);
    testing::internal::AssertHelper::AssertHelper
              (&local_928,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x177,
               "Expected: (witness = tx.SetPeginWitnessStack(index, 0, exp_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_928,&local_920);
    testing::internal::AssertHelper::~AssertHelper(&local_928);
    testing::Message::~Message(&local_920);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    uVar4 = local_17c;
    if (bVar3) {
      sVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         this_00);
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                (&local_948,(ConfidentialTransaction *)local_178,uVar4,(uint32_t)sVar6,
                 (ByteData256 *)local_d8);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_948);
      cfd::core::ScriptWitness::~ScriptWitness(&local_948);
    }
  }
  else {
    testing::Message::Message(&local_950);
    testing::internal::AssertHelper::AssertHelper
              (&local_958,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x17a,
               "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()), exp_data256)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_958,&local_950);
    testing::internal::AssertHelper::~AssertHelper(&local_958);
    testing::Message::~Message(&local_950);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    uVar4 = local_17c;
    if (bVar3) {
      sVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         this_00);
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                (&local_978,(ConfidentialTransaction *)local_178,uVar4,(int)sVar6 + 1,
                 (ByteData160 *)local_98);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_978);
      cfd::core::ScriptWitness::~ScriptWitness(&local_978);
    }
  }
  else {
    testing::Message::Message(&local_980);
    testing::internal::AssertHelper::AssertHelper
              (&local_988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x17d,
               "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 1, exp_data160)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_988,&local_980);
    testing::internal::AssertHelper::~AssertHelper(&local_988);
    testing::Message::~Message(&local_980);
  }
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_10.message_,(ScriptWitness *)&idx);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_10.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_10.message_);
  pvVar9 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,0)
  ;
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_9d0,pvVar9);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_9f0,(ByteData *)local_48);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_9b0,"test_peg_vector[0].GetHex().c_str()","exp_data.GetHex().c_str()"
             ,pcVar5,pcVar10);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_9d0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
  if (!bVar3) {
    testing::Message::Message(&local_9f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x17f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_9f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_9f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
  sVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
  pvVar9 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
                      sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a30,pvVar9);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_a50,(ByteData256 *)local_d8);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a10,"test_peg_vector[exp_peg_vector.size()].GetHex().c_str()",
             "exp_data256.GetHex().c_str()",pcVar5,pcVar10);
  std::__cxx11::string::~string((string *)&local_a50);
  std::__cxx11::string::~string((string *)&local_a30);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
  if (!bVar3) {
    testing::Message::Message(&local_a58);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x181,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_a58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
  sVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
  pvVar9 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
                      sVar6 + 1);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a90,pvVar9);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_ab0,(ByteData160 *)local_98);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a70,"test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str()",
             "exp_data160.GetHex().c_str()",pcVar5,pcVar10);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_a90);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
  if (!bVar3) {
    testing::Message::Message(&local_ab8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a70);
    testing::internal::AssertHelper::AssertHelper
              (&local_ac0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x183,pcVar5);
    testing::internal::AssertHelper::operator=(&local_ac0,&local_ab8);
    testing::internal::AssertHelper::~AssertHelper(&local_ac0);
    testing::Message::~Message(&local_ab8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
  cfd::core::ConfidentialTransaction::GetTxIn
            ((ConfidentialTxInReference *)&idx_3,(ConfidentialTransaction *)local_178,local_17c);
  cfd::core::ConfidentialTxInReference::GetPeginWitness
            (&local_af8,(ConfidentialTxInReference *)&idx_3);
  cfd::core::ScriptWitness::GetWitness(&local_ad8,&local_af8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_3d0,
             &local_ad8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_ad8);
  cfd::core::ScriptWitness::~ScriptWitness(&local_af8);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)&idx_3);
  for (gtest_ar_13.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      sVar1.ptr_ = gtest_ar_13.message_.ptr_,
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          local_3d0), sVar1.ptr_ < pbVar8;
      gtest_ar_13.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_13.message_.ptr_)->field_0x1) {
    pvVar9 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
                        (size_type)gtest_ar_13.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_c90,pvVar9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pvVar9 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        local_3d0,(size_type)gtest_ar_13.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_cb0,pvVar9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_c70,"test_peg_vector[idx].GetHex().c_str()",
               "tx_peg_vector[idx].GetHex().c_str()",pcVar5,pcVar10);
    std::__cxx11::string::~string((string *)&local_cb0);
    std::__cxx11::string::~string((string *)&local_c90);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c70);
    if (!bVar3) {
      testing::Message::Message(&local_cb8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c70);
      testing::internal::AssertHelper::AssertHelper
                (&local_cc0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x187,pcVar5);
      testing::internal::AssertHelper::operator=(&local_cc0,&local_cb8);
      testing::internal::AssertHelper::~AssertHelper(&local_cc0);
      testing::Message::~Message(&local_cb8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c70);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash
                (&local_cd8,(ConfidentialTransaction *)local_178);
      cfd::core::ByteData256::operator=
                ((ByteData256 *)
                 &tx.vout_.
                  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_cd8);
      cfd::core::ByteData256::~ByteData256(&local_cd8);
    }
  }
  else {
    testing::Message::Message(&local_ce0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x18b,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_ce0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_ce0);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_
            (&local_d18,
             (ByteData256 *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_cf8,"witness_only_hash.GetHex().c_str()",
             "\"28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa\"",pcVar5,
             "28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa");
  std::__cxx11::string::~string((string *)&local_d18);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf8);
  if (!bVar3) {
    testing::Message::Message(&local_d20);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_cf8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x18e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_3,&local_d20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_3);
    testing::Message::~Message(&local_d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff2d0,"");
  bVar3 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff2d0);
  if (bVar3) {
    anon_var_0_3._7_1_ = 0;
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::RemovePeginWitnessStackAll
                ((ConfidentialTransaction *)local_178,local_17c + 5);
    }
    if ((anon_var_0_3._7_1_ & 1) != 0) goto LAB_00483ad6;
    pcStack_d30 = 
    "Expected: (tx.RemovePeginWitnessStackAll(index + 5)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_d48);
  testing::internal::AssertHelper::AssertHelper
            (&local_d50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x191,pcStack_d30);
  testing::internal::AssertHelper::operator=(&local_d50,local_d48);
  testing::internal::AssertHelper::~AssertHelper(&local_d50);
  testing::Message::~Message(local_d48);
LAB_00483ad6:
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTransaction::RemovePeginWitnessStackAll
                ((ConfidentialTransaction *)local_178,local_17c);
    }
  }
  else {
    testing::Message::Message(&local_d58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x192,
               "Expected: (tx.RemovePeginWitnessStackAll(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_d58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_d58);
  }
  local_d74 = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum
                        ((ConfidentialTransaction *)local_178,local_17c);
  local_d78 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_d70,"tx.GetPeginWitnessStackNum(index)","0",&local_d74,
             &local_d78);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d70);
  if (!bVar3) {
    testing::Message::Message(&local_d80);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_d70);
    testing::internal::AssertHelper::AssertHelper
              (&local_d88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x193,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d88,&local_d80);
    testing::internal::AssertHelper::~AssertHelper(&local_d88);
    testing::Message::~Message(&local_d80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d70);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_3d0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&idx);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_178)
  ;
  cfd::core::ByteData256::~ByteData256
            ((ByteData256 *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &witness_only_hash.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_d8);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)local_98);
  cfd::core::ByteData::~ByteData((ByteData *)local_48);
  cfd::core::ScriptWitness::~ScriptWitness
            ((ScriptWitness *)
             &exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(ConfidentialTransaction, PeginWitnessTest) {
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();
  const ByteData exp_data("1234567890");
  const ByteData160 exp_data160("1234567890123456789012345678901234567890");
  const ByteData256 exp_data256(
      "1234567890123456789012345678901234567890123456789012345678901234");
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  ByteData256 witness_only_hash = ByteData256();

  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW(
      (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));
  EXPECT_NO_THROW(
      (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy,
                      exp_issuance_amount, exp_inflation_keys,
                      exp_issuance_amount_rangeproof,
                      exp_inflation_keys_rangeproof)));
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), 0);

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99");

  // AddPeginWitness
  ScriptWitness witness;
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_NO_THROW(
        (witness = tx.AddPeginWitnessStack(index, exp_peg_vector[idx])));
  }
  std::vector<ByteData> test_peg_vector = witness.GetWitness();
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 exp_peg_vector[idx].GetHex().c_str());
  }
  std::vector<ByteData> tx_peg_vector = tx.GetTxIn(index).GetPeginWitness()
      .GetWitness();
  for (size_t idx = 0; idx < tx_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 tx_peg_vector[idx].GetHex().c_str());
  }
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), exp_peg_vector.size());

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a");

  // AddPeginWitness(160,256)
  EXPECT_THROW((witness = tx.AddPeginWitnessStack(index + 5, exp_data160)),
               CfdException);
  EXPECT_NO_THROW((witness = tx.AddPeginWitnessStack(index, exp_data160)));
  EXPECT_NO_THROW((witness = tx.AddPeginWitnessStack(index, exp_data256)));
  test_peg_vector = witness.GetWitness();
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size()].GetHex().c_str(),
               exp_data160.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str(),
               exp_data256.GetHex().c_str());
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), exp_peg_vector.size() + 2);

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf");

  // SetPeginWitnessStack
  EXPECT_THROW(
      (witness = tx.SetPeginWitnessStack(index + 5, static_cast<size_t>(exp_peg_vector.size()),
                                         exp_data160)),
      CfdException);
  EXPECT_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 5,
                                         exp_data160)),
      CfdException);
  EXPECT_NO_THROW((witness = tx.SetPeginWitnessStack(index, 0, exp_data)));
  EXPECT_NO_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()),
                                         exp_data256)));
  EXPECT_NO_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 1,
                                         exp_data160)));
  test_peg_vector = witness.GetWitness();
  EXPECT_STREQ(test_peg_vector[0].GetHex().c_str(), exp_data.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size()].GetHex().c_str(),
               exp_data256.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str(),
               exp_data160.GetHex().c_str());
  tx_peg_vector = tx.GetTxIn(index).GetPeginWitness().GetWitness();
  for (size_t idx = 0; idx < tx_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 tx_peg_vector[idx].GetHex().c_str());
  }

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa");

  // RemovePeginWitnessStackAll
  EXPECT_THROW((tx.RemovePeginWitnessStackAll(index + 5)), CfdException);
  EXPECT_NO_THROW((tx.RemovePeginWitnessStackAll(index)));
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), 0);
}